

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

uint32_t add_constant(Vm *vm,CrispyValue value)

{
  CallFrame *pCVar1;
  int iVar2;
  InterpretResult IVar3;
  char *source;
  Compiler CStack_10c8;
  CallFrame *pCStack_20;
  
  source = value._0_8_;
  pCVar1 = (vm->frames).frame_pointers[vm->frame_count - 1];
  if ((pCVar1->constants).count < 0xffff) {
    write_value(&pCVar1->constants,value);
    return (int)(pCVar1->constants).count - 1;
  }
  add_constant_cold_1();
  pCStack_20 = pCVar1;
  init_compiler(&CStack_10c8,source);
  memcpy(&vm->compiler,&CStack_10c8,0x10a8);
  iVar2 = compile(vm);
  IVar3 = INTERPRET_COMPILE_ERROR;
  if (iVar2 == 0) {
    pCVar1 = (vm->frames).frame_pointers[vm->frame_count - 1];
    pCVar1->ip = (pCVar1->code_buffer).code;
    vm->current_status = VM_STATUS_RUNNING;
    IVar3 = run(vm);
    var_ht_free((vm->compiler).scope);
  }
  return IVar3;
}

Assistant:

uint32_t add_constant(Vm *vm, CrispyValue value) {
    CallFrame *call_frame = CURR_FRAME(vm);
    if (call_frame->constants.count >= UINT16_MAX) {
        fprintf(stderr, "Too many constants.\n");
        exit(45);
    }

    write_value(&call_frame->constants, value);
    return (uint32_t) (call_frame->constants.count - 1);
}